

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_opengl.h
# Opt level: O2

bool djgt__glTexSubImage3D
               (djg_texture *texture,GLenum target,GLint xoffset,GLint yoffset,GLint zoffset)

{
  GLsizei GVar1;
  GLsizei GVar2;
  PFNGLTEXSUBIMAGE3DPROC p_Var3;
  bool bVar4;
  int iVar5;
  GLenum GVar6;
  uint uVar7;
  GLenum GVar8;
  djgt__glpss backup;
  GLint local_58 [10];
  
  local_58[4] = 0;
  local_58[5] = 0;
  local_58[6] = 0;
  local_58[7] = 0;
  local_58[0] = 0;
  local_58[1] = 0;
  local_58[2] = 0;
  local_58[3] = 0;
  local_58[8] = 2;
  djgt__get_glpus(backup);
  iVar5 = bcmp(local_58,backup,0x24);
  if (iVar5 != 0) {
    djgt__set_glpus(local_58);
  }
  p_Var3 = glad_glTexSubImage3D;
  GVar1 = texture->x;
  GVar2 = texture->y;
  GVar6 = djgt__glformat(texture->comp);
  uVar7 = texture->pf - 1;
  GVar8 = 0x500;
  if (uVar7 < 4) {
    GVar8 = *(GLenum *)(&DAT_0019c740 + (ulong)uVar7 * 4);
  }
  (*p_Var3)(target,0,0,0,xoffset,GVar1,GVar2,1,GVar6,GVar8,texture->texels);
  if (iVar5 != 0) {
    djgt__set_glpus(backup);
  }
  bVar4 = djgt__validate();
  return bVar4;
}

Assistant:

static bool
djgt__glTexSubImage3D(
    const djg_texture *texture,
    GLenum target,
    GLint xoffset,
    GLint yoffset,
    GLint zoffset
) {
    djgt__glpss pus = {0, 0, 0, 0, 0, 0 ,0, 0, 2};
    djgt__glpss backup;
    bool reset;

    djgt__get_glpus(backup);
    reset = memcmp(pus, backup, sizeof(djgt__glpss)) != 0;
    if (reset) djgt__set_glpus(pus);
    glTexSubImage3D(target,
           /*level*/0,
                    xoffset,
                    yoffset,
                    zoffset,
                    texture->x,
                    texture->y,
           /*depth*/1,
                    djgt__glformat(texture->comp),
                    djgt__gltype(texture->pf),
                    texture->texels);
    if (reset) djgt__set_glpus(backup);

    return djgt__validate();
}